

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void typeofFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  int iVar1;
  char *local_28;
  char *z;
  sqlite3_value **argv_local;
  int NotUsed_local;
  sqlite3_context *context_local;
  
  iVar1 = sqlite3_value_type(*argv);
  switch(iVar1) {
  case 1:
    local_28 = "integer";
    break;
  case 2:
    local_28 = "real";
    break;
  case 3:
    local_28 = "text";
    break;
  case 4:
    local_28 = "blob";
    break;
  default:
    local_28 = "null";
  }
  sqlite3_result_text(context,local_28,-1,(_func_void_void_ptr *)0x0);
  return;
}

Assistant:

static void typeofFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  const char *z = 0;
  UNUSED_PARAMETER(NotUsed);
  switch( sqlite3_value_type(argv[0]) ){
    case SQLITE_INTEGER: z = "integer"; break;
    case SQLITE_TEXT:    z = "text";    break;
    case SQLITE_FLOAT:   z = "real";    break;
    case SQLITE_BLOB:    z = "blob";    break;
    default:             z = "null";    break;
  }
  sqlite3_result_text(context, z, -1, SQLITE_STATIC);
}